

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

ConditionalDirectiveExpressionSyntax * __thiscall
slang::parsing::Preprocessor::parseConditionalExprTop(Preprocessor *this)

{
  SourceRange range;
  string_view arg;
  undefined1 uVar1;
  size_t in_RDI;
  Token TVar2;
  Token id;
  ConditionalDirectiveExpressionSyntax *result;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Preprocessor_cpp:1195:29)>
  guard;
  Info *in_stack_ffffffffffffff30;
  Preprocessor *in_stack_ffffffffffffff38;
  SourceLocation in_stack_ffffffffffffff40;
  SourceLocation in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  DiagCode code;
  undefined7 in_stack_ffffffffffffff70;
  Preprocessor *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffffbc;
  TokenKind kind;
  Preprocessor *in_stack_ffffffffffffffc0;
  anon_class_8_1_8991fb9c_for_func local_28;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Preprocessor_cpp:1195:29)>
  local_20;
  NamedConditionalDirectiveExpressionSyntax *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff50 >> 0x20,0);
  kind = (TokenKind)((uint)in_stack_ffffffffffffffbc >> 0x10);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/parsing/Preprocessor.cpp:1195:29)>
  ::ScopeGuard(&local_20,&local_28);
  *(undefined1 *)(in_RDI + 0x1f9) = 1;
  uVar1 = peek((Preprocessor *)in_stack_ffffffffffffff40,
               (TokenKind)((ulong)in_stack_ffffffffffffff38 >> 0x30));
  if ((bool)uVar1) {
    local_8 = (NamedConditionalDirectiveExpressionSyntax *)
              parseConditionalExpr(in_stack_ffffffffffffff80);
    if (*(int *)(in_RDI + 0x1c) < 1) {
      slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff80);
      range.endLoc = in_stack_ffffffffffffff48;
      range.startLoc = in_stack_ffffffffffffff40;
      addDiag(in_stack_ffffffffffffff38,code,range);
      slang::toString(Default);
      arg._M_str = (char *)in_stack_ffffffffffffff80;
      arg._M_len = in_RDI;
      Diagnostic::operator<<((Diagnostic *)CONCAT17(uVar1,in_stack_ffffffffffffff70),arg);
    }
    TVar2.info = in_stack_ffffffffffffff30;
    TVar2._0_8_ = in_stack_ffffffffffffff38;
  }
  else {
    TVar2 = expect(in_stack_ffffffffffffffc0,kind);
    local_8 = BumpAllocator::
              emplace<slang::syntax::NamedConditionalDirectiveExpressionSyntax,slang::parsing::Token&>
                        ((BumpAllocator *)in_stack_ffffffffffffff40,TVar2._0_8_);
  }
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/parsing/Preprocessor.cpp:1195:29)>
  ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source_parsing_Preprocessor_cpp:1195:29)>
                 *)TVar2.info);
  return &local_8->super_ConditionalDirectiveExpressionSyntax;
}

Assistant:

ConditionalDirectiveExpressionSyntax& Preprocessor::parseConditionalExprTop() {
    SLANG_ASSERT(!inIfDefCondition);
    auto guard = ScopeGuard([this] { inIfDefCondition = false; });
    inIfDefCondition = true;

    if (peek(TokenKind::OpenParenthesis)) {
        auto result = parseConditionalExpr();
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, result->sourceRange())
                << toString(options.languageVersion);
        }
        return *result;
    }

    auto id = expect(TokenKind::Identifier);
    return *alloc.emplace<NamedConditionalDirectiveExpressionSyntax>(id);
}